

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.h
# Opt level: O0

Matrix<float,_3,_1,_0,_3,_1> __thiscall
Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::eulerAngles
          (MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *this,Index a0,Index a1,Index a2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Scalar SVar7;
  Scalar SVar8;
  CoeffReturnType pfVar9;
  Scalar *pSVar10;
  CoeffReturnType pfVar11;
  Index in_R8;
  RealScalar RVar12;
  Scalar SVar13;
  double dVar14;
  ulong uVar15;
  ulong extraout_XMM0_Qa;
  float fVar16;
  Matrix<float,_3,_1,_0,_3,_1> MVar17;
  NegativeReturnType local_98;
  float local_84;
  float local_80;
  Scalar c1_1;
  Scalar s1_1;
  RealScalar local_74;
  float local_70;
  Scalar c2;
  Scalar c1;
  Scalar s1;
  RealScalar local_60;
  Matrix<float,2,1,0,2,1> local_5c [4];
  Scalar s2_1;
  RealScalar local_54;
  long lStack_50;
  Scalar s2;
  Index k;
  Index j;
  Index i;
  Index odd;
  Index a2_local;
  Index a1_local;
  Index a0_local;
  MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *this_local;
  Matrix<float,_3,_1,_0,_3,_1> *res;
  
  odd = in_R8;
  a2_local = a2;
  a1_local = a1;
  a0_local = a0;
  this_local = this;
  Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)this);
  i = (Index)(int)(uint)((a1_local + 1) % 3 != a2_local);
  j = a1_local;
  k = (a1_local + 1 + i) % 3;
  lStack_50 = ((a1_local + 2) - i) % 3;
  if (a1_local == odd) {
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,k,a1_local);
    fVar1 = *pfVar9;
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,lStack_50,j);
    dVar14 = std::atan2((double)(ulong)(uint)fVar1,(double)(ulong)(uint)*pfVar9);
    pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
    *pSVar10 = SUB84(dVar14,0);
    if (((i != 0) &&
        (pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0),
        *pSVar10 <= 0.0 && *pSVar10 != 0.0)) ||
       ((i == 0 &&
        (pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0),
        0.0 < *pSVar10)))) {
      pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
      if (*pSVar10 <= 0.0) {
        pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
        *pSVar10 = *pSVar10 + 3.1415927;
      }
      else {
        pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
        *pSVar10 = *pSVar10 - 3.1415927;
      }
      pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,k,j);
      pfVar11 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                          ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,lStack_50,j
                          );
      Matrix<float,2,1,0,2,1>::Matrix<float,float>(local_5c,pfVar9,pfVar11);
      RVar12 = MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::norm
                         ((MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)local_5c);
      local_54 = RVar12;
      pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,j,j);
      dVar14 = std::atan2((double)(ulong)(uint)RVar12,(double)(ulong)(uint)*pfVar9);
      pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,1);
      *pSVar10 = -SUB84(dVar14,0);
    }
    else {
      pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,k,j);
      pfVar11 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                          ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,lStack_50,j
                          );
      Matrix<float,2,1,0,2,1>::Matrix<float,float>((Matrix<float,2,1,0,2,1> *)&c1,pfVar9,pfVar11);
      RVar12 = MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::norm
                         ((MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&c1);
      local_60 = RVar12;
      pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,j,j);
      dVar14 = std::atan2((double)(ulong)(uint)RVar12,(double)(ulong)(uint)*pfVar9);
      pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,1);
      *pSVar10 = SUB84(dVar14,0);
    }
    pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
    dVar14 = std::sin((double)(ulong)(uint)*pSVar10);
    c2 = SUB84(dVar14,0);
    pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
    dVar14 = std::cos((double)(ulong)(uint)*pSVar10);
    local_70 = SUB84(dVar14,0);
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,k,lStack_50);
    SVar7 = c2;
    fVar1 = *pfVar9;
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,lStack_50,
                        lStack_50);
    fVar3 = local_70;
    fVar2 = *pfVar9;
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,k,k);
    SVar8 = c2;
    fVar16 = *pfVar9;
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,lStack_50,k);
    fVar16 = fVar3 * fVar16 + -(SVar8 * *pfVar9);
    dVar14 = std::atan2((double)(ulong)(uint)(SUB84(dVar14,0) * fVar1 + -(SVar7 * fVar2)),
                        (double)(ulong)(uint)fVar16);
    SVar13 = SUB84(dVar14,0);
    pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,2);
    *pSVar10 = SVar13;
  }
  else {
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,k,lStack_50);
    fVar1 = *pfVar9;
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,lStack_50,
                        lStack_50);
    dVar14 = std::atan2((double)(ulong)(uint)fVar1,(double)(ulong)(uint)*pfVar9);
    pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
    *pSVar10 = SUB84(dVar14,0);
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,j,j);
    pfVar11 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                        ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,j,k);
    Matrix<float,2,1,0,2,1>::Matrix<float,float>((Matrix<float,2,1,0,2,1> *)&c1_1,pfVar9,pfVar11);
    local_74 = MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::norm
                         ((MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&c1_1);
    if (((i != 0) &&
        (pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0),
        *pSVar10 <= 0.0 && *pSVar10 != 0.0)) ||
       ((i == 0 &&
        (pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0),
        0.0 < *pSVar10)))) {
      pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
      if (*pSVar10 <= 0.0) {
        pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
        *pSVar10 = *pSVar10 + 3.1415927;
      }
      else {
        pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
        *pSVar10 = *pSVar10 - 3.1415927;
      }
      pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,j,lStack_50)
      ;
      dVar14 = std::atan2((double)(ulong)(uint)-*pfVar9,(double)(ulong)(uint)-local_74);
      pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,1);
      *pSVar10 = SUB84(dVar14,0);
    }
    else {
      pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,j,lStack_50)
      ;
      dVar14 = std::atan2((double)(ulong)(uint)-*pfVar9,(double)(ulong)(uint)local_74);
      pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,1);
      *pSVar10 = SUB84(dVar14,0);
    }
    pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
    dVar14 = std::sin((double)(ulong)(uint)*pSVar10);
    local_80 = SUB84(dVar14,0);
    pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
    dVar14 = std::cos((double)(ulong)(uint)*pSVar10);
    fVar5 = local_80;
    local_84 = SUB84(dVar14,0);
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,lStack_50,j);
    fVar3 = local_84;
    fVar1 = *pfVar9;
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,k,j);
    fVar4 = local_84;
    fVar2 = *pfVar9;
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,k,k);
    fVar6 = local_80;
    fVar16 = *pfVar9;
    pfVar9 = DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::coeff
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)a0,lStack_50,k);
    fVar16 = fVar4 * fVar16 + -(fVar6 * *pfVar9);
    dVar14 = std::atan2((double)(ulong)(uint)(fVar5 * fVar1 + -(fVar3 * fVar2)),
                        (double)(ulong)(uint)fVar16);
    SVar13 = SUB84(dVar14,0);
    pSVar10 = DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,2);
    *pSVar10 = SVar13;
  }
  uVar15 = (ulong)(uint)SVar13;
  if (i == 0) {
    DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator-
              (&local_98,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this);
    Matrix<float,3,1,0,3,1>::operator=
              ((Matrix<float,3,1,0,3,1> *)this,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                *)&local_98);
    uVar15 = extraout_XMM0_Qa;
  }
  MVar17.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fVar16;
  MVar17.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (float)(int)uVar15;
  MVar17.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (float)(int)(uVar15 >> 0x20);
  return (Matrix<float,_3,_1,_0,_3,_1>)
         MVar17.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

EIGEN_DEVICE_FUNC inline Matrix<typename MatrixBase<Derived>::Scalar,3,1>
MatrixBase<Derived>::eulerAngles(Index a0, Index a1, Index a2) const
{
  EIGEN_USING_STD(atan2)
  EIGEN_USING_STD(sin)
  EIGEN_USING_STD(cos)
  /* Implemented from Graphics Gems IV */
  EIGEN_STATIC_ASSERT_MATRIX_SPECIFIC_SIZE(Derived,3,3)

  Matrix<Scalar,3,1> res;
  typedef Matrix<typename Derived::Scalar,2,1> Vector2;

  const Index odd = ((a0+1)%3 == a1) ? 0 : 1;
  const Index i = a0;
  const Index j = (a0 + 1 + odd)%3;
  const Index k = (a0 + 2 - odd)%3;
  
  if (a0==a2)
  {
    res[0] = atan2(coeff(j,i), coeff(k,i));
    if((odd && res[0]<Scalar(0)) || ((!odd) && res[0]>Scalar(0)))
    {
      if(res[0] > Scalar(0)) {
        res[0] -= Scalar(EIGEN_PI);
      }
      else {
        res[0] += Scalar(EIGEN_PI);
      }
      Scalar s2 = Vector2(coeff(j,i), coeff(k,i)).norm();
      res[1] = -atan2(s2, coeff(i,i));
    }
    else
    {
      Scalar s2 = Vector2(coeff(j,i), coeff(k,i)).norm();
      res[1] = atan2(s2, coeff(i,i));
    }
    
    // With a=(0,1,0), we have i=0; j=1; k=2, and after computing the first two angles,
    // we can compute their respective rotation, and apply its inverse to M. Since the result must
    // be a rotation around x, we have:
    //
    //  c2  s1.s2 c1.s2                   1  0   0 
    //  0   c1    -s1       *    M    =   0  c3  s3
    //  -s2 s1.c2 c1.c2                   0 -s3  c3
    //
    //  Thus:  m11.c1 - m21.s1 = c3  &   m12.c1 - m22.s1 = s3
    
    Scalar s1 = sin(res[0]);
    Scalar c1 = cos(res[0]);
    res[2] = atan2(c1*coeff(j,k)-s1*coeff(k,k), c1*coeff(j,j) - s1 * coeff(k,j));
  } 
  else
  {
    res[0] = atan2(coeff(j,k), coeff(k,k));
    Scalar c2 = Vector2(coeff(i,i), coeff(i,j)).norm();
    if((odd && res[0]<Scalar(0)) || ((!odd) && res[0]>Scalar(0))) {
      if(res[0] > Scalar(0)) {
        res[0] -= Scalar(EIGEN_PI);
      }
      else {
        res[0] += Scalar(EIGEN_PI);
      }
      res[1] = atan2(-coeff(i,k), -c2);
    }
    else
      res[1] = atan2(-coeff(i,k), c2);
    Scalar s1 = sin(res[0]);
    Scalar c1 = cos(res[0]);
    res[2] = atan2(s1*coeff(k,i)-c1*coeff(j,i), c1*coeff(j,j) - s1 * coeff(k,j));
  }
  if (!odd)
    res = -res;
  
  return res;
}